

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brake.hpp
# Opt level: O2

void __thiscall ruckig::BrakeProfile::finalize(BrakeProfile *this,double *ps,double *vs,double *as)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  tuple<double,_double,_double> local_58;
  double *local_38;
  double *local_30;
  double *local_28;
  
  dVar1 = (this->t)._M_elems[0];
  if ((0.0 < dVar1) || (0.0 < (this->t)._M_elems[1])) {
    this->duration = dVar1;
    (this->p)._M_elems[0] = *ps;
    (this->v)._M_elems[0] = *vs;
    dVar2 = *as;
    (this->a)._M_elems[0] = dVar2;
    dVar3 = (this->j)._M_elems[0];
    dVar4 = dVar1 * dVar3;
    local_58.super__Tuple_impl<0UL,_double,_double,_double>.super__Head_base<0UL,_double,_false>.
    _M_head_impl = ((dVar4 / 6.0 + dVar2 * 0.5) * dVar1 + *vs) * dVar1 + *ps;
    local_58.super__Tuple_impl<0UL,_double,_double,_double>.super__Tuple_impl<1UL,_double,_double>.
    super__Tuple_impl<2UL,_double>.super__Head_base<2UL,_double,_false>._M_head_impl =
         (_Head_base<2UL,_double,_false>)(dVar2 + dVar3 * dVar1);
    local_58.super__Tuple_impl<0UL,_double,_double,_double>.super__Tuple_impl<1UL,_double,_double>.
    super__Head_base<1UL,_double,_false>._M_head_impl = *vs + (dVar4 * 0.5 + dVar2) * dVar1;
    local_38 = as;
    local_30 = vs;
    local_28 = ps;
    std::tuple<double&,double&,double&>::operator=
              ((tuple<double&,double&,double&> *)&local_38,&local_58);
    dVar1 = (this->t)._M_elems[1];
    if (0.0 < dVar1) {
      this->duration = this->duration + dVar1;
      (this->p)._M_elems[1] = *ps;
      (this->v)._M_elems[1] = *vs;
      dVar2 = *as;
      (this->a)._M_elems[1] = dVar2;
      dVar3 = (this->j)._M_elems[1];
      dVar4 = dVar1 * dVar3;
      local_58.super__Tuple_impl<0UL,_double,_double,_double>.super__Head_base<0UL,_double,_false>.
      _M_head_impl = ((dVar4 / 6.0 + dVar2 * 0.5) * dVar1 + *vs) * dVar1 + *ps;
      local_58.super__Tuple_impl<0UL,_double,_double,_double>.super__Tuple_impl<1UL,_double,_double>
      .super__Tuple_impl<2UL,_double>.super__Head_base<2UL,_double,_false>._M_head_impl =
           (_Head_base<2UL,_double,_false>)(dVar2 + dVar3 * dVar1);
      local_58.super__Tuple_impl<0UL,_double,_double,_double>.super__Tuple_impl<1UL,_double,_double>
      .super__Head_base<1UL,_double,_false>._M_head_impl = *vs + (dVar4 * 0.5 + dVar2) * dVar1;
      local_38 = as;
      local_30 = vs;
      local_28 = ps;
      std::tuple<double&,double&,double&>::operator=
                ((tuple<double&,double&,double&> *)&local_38,&local_58);
    }
  }
  else {
    this->duration = 0.0;
  }
  return;
}

Assistant:

void finalize(double& ps, double& vs, double& as) {
        if (t[0] <= 0.0 && t[1] <= 0.0) {
            duration = 0.0;
            return;
        }

        duration = t[0];
        p[0] = ps;
        v[0] = vs;
        a[0] = as;
        std::tie(ps, vs, as) = integrate(t[0], ps, vs, as, j[0]);

        if (t[1] > 0.0) {
            duration += t[1];
            p[1] = ps;
            v[1] = vs;
            a[1] = as;
            std::tie(ps, vs, as) = integrate(t[1], ps, vs, as, j[1]);
        }
    }